

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

void cleanup_mon_spell(void)

{
  monster_spell *pmVar1;
  monster_spell_level *p;
  monster_spell_level *pmVar2;
  monster_spell *p_00;
  
  p_00 = monster_spells;
  if (monster_spells != (monster_spell *)0x0) {
    do {
      pmVar1 = p_00->next;
      p = p_00->level;
      free_effect(p_00->effect);
      while (p != (monster_spell_level *)0x0) {
        pmVar2 = p->next;
        string_free(p->lore_desc);
        string_free(p->message);
        string_free(p->blind_message);
        string_free(p->miss_message);
        string_free(p->save_message);
        mem_free(p);
        p = pmVar2;
      }
      mem_free(p_00);
      p_00 = pmVar1;
    } while (pmVar1 != (monster_spell *)0x0);
  }
  return;
}

Assistant:

static void cleanup_mon_spell(void)
{
	struct monster_spell *rs = monster_spells;
	struct monster_spell *next;
	struct monster_spell_level *level;

	while (rs) {
		next = rs->next;
		level = rs->level;
		free_effect(rs->effect);
		while (level) {
			struct monster_spell_level *next_level = level->next;
			string_free(level->lore_desc);
			string_free(level->message);
			string_free(level->blind_message);
			string_free(level->miss_message);
			string_free(level->save_message);
			mem_free(level);
			level = next_level;
		}
		mem_free(rs);
		rs = next;
	}
}